

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

double __thiscall
BayesianGameCollaborativeGraphical::ComputeValueJPol
          (BayesianGameCollaborativeGraphical *this,JointPolicyDiscretePure *jpolBG)

{
  undefined1 auVar1 [16];
  BayesianGameCollaborativeGraphical *pBVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  const_reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  size_type __n;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIs_e;
  allocator_type local_d5;
  uint local_d4;
  double local_d0;
  value_type_conflict1 local_c4;
  BayesianGameCollaborativeGraphical *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  iVar4 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x15])();
  local_b0 = CONCAT44(extraout_var,iVar4);
  local_b8 = &(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrTypes;
  auVar12 = ZEXT864(0) << 0x40;
  uVar9 = 0;
  local_d0 = 0.0;
  local_c0 = this;
  while( true ) {
    local_d4 = (uint)uVar9;
    if (local_b0 <= uVar9) break;
    (*(local_c0->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x16])(&local_90,local_c0);
    local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    __n = (long)local_90._M_impl.super__Vector_impl_data._M_finish -
          (long)local_90._M_impl.super__Vector_impl_data._M_start >> 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__n,
               (value_type_conflict1 *)&local_60,(allocator_type *)&local_78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
               (long)local_90._M_impl.super__Vector_impl_data._M_finish -
               (long)local_90._M_impl.super__Vector_impl_data._M_start >> 2,
               (allocator_type *)&local_78);
    IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
              (local_b8,(Scope *)&local_90,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
    auVar14 = ZEXT864(0) << 0x40;
    do {
      local_c4 = 0;
      local_98 = auVar14._0_8_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,__n,&local_c4,
                 &local_d5);
      uVar6 = 0;
      while( true ) {
        pBVar2 = local_c0;
        uVar5 = local_d4;
        uVar10 = auVar12._0_8_;
        uVar9 = (ulong)uVar6;
        if (__n <= uVar9) break;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,uVar9);
        uVar5 = *pvVar7;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,uVar9);
        uVar5 = (*(jpolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                          (jpolBG,(ulong)uVar5,(ulong)*pvVar8);
        local_78._M_impl.super__Vector_impl_data._M_start[uVar9] = uVar5;
        uVar6 = uVar6 + 1;
      }
      (*(local_c0->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x1b])(local_c0,(ulong)local_d4,&local_48);
      local_a0 = uVar10;
      (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x20])(pBVar2,(ulong)uVar5,&local_48,&local_78);
      local_a8 = uVar10;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
      bVar3 = IndexTools::Increment
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_98;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_a8;
      auVar12 = ZEXT1664(auVar11);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_a0;
      auVar1 = vfmadd231sd_fma(auVar13,auVar11,auVar1);
      auVar14 = ZEXT1664(auVar1);
    } while (!bVar3);
    local_d0 = local_d0 + auVar1._0_8_;
    auVar12 = ZEXT864((ulong)local_d0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
    uVar9 = (ulong)(local_d4 + 1);
  }
  return local_d0;
}

Assistant:

double BayesianGameCollaborativeGraphical::
ComputeValueJPol(
    const JointPolicyDiscretePure & jpolBG
) const
{
    size_t nrR = GetNrLRFs();
    double r = 0.0; //immediate reward (exact)
    for(Index e=0; e < nrR; e++)
    {
        double r_e = 0.0;
        const Scope & agSc = GetScope(e);
        size_t nrAgents_e = agSc.size();
        vector<Index> typeIs_e(nrAgents_e, 0);
        vector<size_t> nrTypes_e(agSc.size());
        IndexTools::RestrictIndividualIndicesToScope(
            GetNrTypes(), agSc, nrTypes_e);

        do{
            //compute the action specified by jpolBG
            vector<Index> aIs_e(nrAgents_e, 0);
            for(Index i=0; i < nrAgents_e; i++)
            {
                Index agI = agSc.at(i);
                Index actionI = jpolBG.GetActionIndex(agI, typeIs_e.at(i));
                aIs_e[i] = actionI;
            }
            double p = GetProbability(e, typeIs_e);
            double this_r =GetUtility(e, typeIs_e, aIs_e);
            r_e += this_r * p;

        }while(!IndexTools::Increment(typeIs_e, nrTypes_e ) );
        r += r_e;

    }
    return r;    
}